

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_cipher_cleanup(EVP_CIPHER_CTX *ctx)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  gost_grasshopper_cipher_ctx_ctr *ctx_1;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  if (lVar2 != 0) {
    uVar3 = EVP_CIPHER_CTX_get0_cipher(ctx);
    iVar1 = EVP_CIPHER_get_mode(uVar3);
    if (iVar1 == 5) {
      if (*(long *)(lVar2 + 0x1c8) != 0) {
        EVP_MD_CTX_free();
      }
      *(undefined8 *)(lVar2 + 0x198) = 0;
      *(undefined8 *)(lVar2 + 0x1a0) = 0;
    }
    EVP_CIPHER_CTX_set_app_data((EVP_CIPHER_CTX *)ctx,(void *)0x0);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_cleanup(EVP_CIPHER_CTX *ctx)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);

    if (!c)
        return 1;

    if (EVP_CIPHER_CTX_mode(ctx) == EVP_CIPH_CTR_MODE)
        gost_grasshopper_cipher_destroy_ctr(c);

    EVP_CIPHER_CTX_set_app_data(ctx, NULL);

    return 1;
}